

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::stats_alert::stats_alert
          (stats_alert *this,stack_allocator *alloc,torrent_handle *h,int in,stat *s)

{
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_00456580;
  (this->transferred)._M_elems[0] = s->m_stat[0].m_counter;
  (this->transferred)._M_elems[1] = s->m_stat[1].m_counter;
  (this->transferred)._M_elems[2] = s->m_stat[2].m_counter;
  (this->transferred)._M_elems[3] = s->m_stat[3].m_counter;
  (this->transferred)._M_elems[4] = s->m_stat[4].m_counter;
  (this->transferred)._M_elems[7] = s->m_stat[5].m_counter;
  (this->transferred)._M_elems[5] = 0;
  (this->transferred)._M_elems[6] = 0;
  (this->transferred)._M_elems[8] = 0;
  (this->transferred)._M_elems[9] = 0;
  this->interval = in;
  return;
}

Assistant:

stats_alert::stats_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, int in, stat const& s)
		: torrent_alert(alloc, h)
		, transferred(stat_to_array(s))
		, interval(in)
	{}